

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,int Required,Vec_Int_t *vBackup)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  uint uVar6;
  word wVar7;
  uint uVar8;
  word *pwVar9;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  word local_50;
  
  uVar6 = *(uint *)pM;
  if (-1 < (int)uVar6) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6b9,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if (Required < pM->D) {
    __assert_fail("pM->D <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if ((uVar6 >> 0x1e & 1) == 0) {
    if ((i < 0) || ((p->vCutSets).nSize <= i)) {
LAB_00788a78:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = (p->vCutSets).pArray[(uint)i];
    if (iVar2 == 0) {
      return 0;
    }
    uVar8 = iVar2 >> 0x10;
    if (((int)uVar8 < 0) || ((p->vPages).nSize <= (int)uVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar6 = uVar6 >> 0x14 & 0x3ff;
    if (uVar6 == 0) {
      __assert_fail("h > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0x94,"int *Nf_CutFromHandle(int *, int)");
    }
    pvVar4 = (p->vPages).pArray[uVar8];
    bVar10 = 0;
    if ((*(byte *)((long)pvVar4 + (ulong)uVar6 * 4 + (ulong)(ushort)iVar2 * 4) & 0x1f) == 0) {
      local_50 = 0;
    }
    else {
      puVar1 = (uint *)((long)pvVar4 + (ulong)uVar6 * 4 + (ulong)(ushort)iVar2 * 4);
      uVar11 = 0;
      local_50 = 0;
      do {
        uVar6 = puVar1[(ulong)(((uint)pM->Cfg >> 8) >> (bVar10 & 0x1f) & 0xf) + 1];
        if ((ulong)uVar6 == 0) break;
        bVar12 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar11 & 0x1f) & 1) != 0;
        iVar2 = *(int *)((long)p->pCells->iDelays +
                        uVar11 * 4 + (ulong)((*(uint *)pM & 0xfffff) * 0x50));
        if (vBackup != (Vec_Int_t *)0x0) {
          if ((int)uVar6 < 0) goto LAB_00788a59;
          Vec_IntPush(vBackup,(uint)bVar12 + uVar6 * 2);
        }
        if ((int)uVar6 < 0) goto LAB_00788a59;
        uVar8 = (uint)bVar12 + uVar6 * 2;
        if ((p->vMapRefs).nSize <= (int)uVar8) goto LAB_00788a78;
        piVar5 = (p->vMapRefs).pArray;
        iVar3 = piVar5[uVar8];
        if (iVar3 < 0) {
          __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                        ,0x6cd,
                        "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
        }
        piVar5[uVar8] = iVar3 + 1;
        if (iVar3 == 0) {
          wVar7 = Nf_MatchRef_rec(p,uVar6,(uint)bVar12,p->pNfObjs[uVar6].M[bVar12],Required - iVar2,
                                  vBackup);
          local_50 = local_50 + wVar7;
        }
        uVar11 = uVar11 + 1;
        bVar10 = bVar10 + 4;
      } while (uVar11 < (*puVar1 & 0x1f));
    }
    pwVar9 = (word *)((long)p->pCells->iDelays + ((ulong)((*(uint *)pM & 0xfffff) * 0x50) - 0x14));
  }
  else {
    iVar2 = p->InvDelayI;
    if (vBackup != (Vec_Int_t *)0x0) {
      if (i < 0) goto LAB_00788a59;
      Vec_IntPush(vBackup,(uint)(c == 0) + i * 2);
    }
    if (i < 0) {
LAB_00788a59:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar6 = (uint)(c == 0) + i * 2;
    if ((p->vMapRefs).nSize <= (int)uVar6) goto LAB_00788a78;
    piVar5 = (p->vMapRefs).pArray;
    iVar3 = piVar5[uVar6];
    if (iVar3 < 0) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0x6c0,
                    "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
    }
    piVar5[uVar6] = iVar3 + 1;
    if (iVar3 == 0) {
      local_50 = Nf_MatchRef_rec(p,i,(uint)(c == 0),p->pNfObjs[(uint)i].M[c == 0],Required - iVar2,
                                 vBackup);
    }
    else {
      local_50 = 0;
    }
    pwVar9 = &p->InvAreaW;
  }
  return local_50 + *pwVar9;
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, int Required, Vec_Int_t * vBackup )
{
    word Area = 0;
    int ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelayI;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->iDelays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}